

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  long *__s;
  char *pcVar1;
  string *in_RDI;
  string s;
  allocator<char> local_39;
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,FLAGS_gtest_output_abi_cxx11_,
             DAT_00174738 + FLAGS_gtest_output_abi_cxx11_);
  __s = local_38[0];
  pcVar1 = strchr((char *)local_38[0],0x3a);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,(char *)__s,&local_39);
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();
  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == nullptr)
             ? std::string(gtest_output_flag)
             : std::string(gtest_output_flag,
                           static_cast<size_t>(colon - gtest_output_flag));
}